

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O3

int wally_hex_verify(char *hex)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = -2;
  if ((hex != (char *)0x0) && (sVar1 = strlen(hex), (sVar1 & 1) == 0 && sVar1 != 0)) {
    sVar2 = 0;
    do {
      if (9 < (byte)(hex[sVar2] - 0x30U)) {
        uVar4 = (byte)hex[sVar2] - 0x41;
        if (0x25 < uVar4) {
          return -2;
        }
        if ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          return -2;
        }
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int wally_hex_verify(const char *hex)
{
    return wally_hex_n_verify(hex, hex ? strlen(hex) : 0);
}